

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

int fio_uuid_unlink(intptr_t uuid,void *obj)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  int ret;
  void *obj_local;
  intptr_t uuid_local;
  
  if (((-1 < uuid) && (uVar1 = (uint)((ulong)uuid >> 8), uVar1 < fio_data->capa)) &&
     ((uuid & 0xffU) == (ulong)*(byte *)((long)fio_data + (long)(int)uVar1 * 0xa8 + 0x6d))) {
    fio_lock((fio_lock_i *)((long)fio_data + (long)(int)uVar1 * 0xa8 + 0x6e));
    if (((-1 < uuid) && (uVar1 < fio_data->capa)) &&
       ((uuid & 0xffU) == (ulong)*(byte *)((long)fio_data + (long)(int)uVar1 * 0xa8 + 0x6d))) {
      iVar2 = fio_uuid_links_remove
                        ((fio_uuid_links_s *)((long)fio_data + (long)(int)uVar1 * 0xa8 + 0xb8),
                         (uintptr_t)obj,(fio_uuid_link_fn)0x0,(fio_uuid_link_fn *)0x0);
      if (iVar2 != 0) {
        piVar3 = __errno_location();
        *piVar3 = 0x6b;
      }
      fio_unlock((fio_lock_i *)((long)fio_data + (long)(int)uVar1 * 0xa8 + 0x6e));
      return iVar2;
    }
    fio_unlock((fio_lock_i *)((long)fio_data + (long)(int)uVar1 * 0xa8 + 0x6e));
  }
  piVar3 = __errno_location();
  *piVar3 = 9;
  return -1;
}

Assistant:

int fio_uuid_unlink(intptr_t uuid, void *obj) {
  if (!uuid_is_valid(uuid))
    goto invalid;
  fio_lock(&uuid_data(uuid).sock_lock);
  if (!uuid_is_valid(uuid))
    goto locked_invalid;
  /* default object comparison is always true */
  int ret =
      fio_uuid_links_remove(&uuid_data(uuid).links, (uintptr_t)obj, NULL, NULL);
  if (ret)
    errno = ENOTCONN;
  fio_unlock(&uuid_data(uuid).sock_lock);
  return ret;
locked_invalid:
  fio_unlock(&uuid_data(uuid).sock_lock);
invalid:
  errno = EBADF;
  return -1;
}